

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O1

void WebPIDelete(WebPIDecoder *idec)

{
  VP8Decoder *dec;
  
  if (idec != (WebPIDecoder *)0x0) {
    dec = (VP8Decoder *)idec->dec_;
    if (dec != (VP8Decoder *)0x0) {
      if (idec->is_lossless_ == 0) {
        if (idec->state_ == STATE_VP8_DATA) {
          VP8ExitCritical(dec,&idec->io_);
        }
        VP8Delete((VP8Decoder *)idec->dec_);
      }
      else {
        VP8LDelete((VP8LDecoder *)dec);
      }
    }
    if ((idec->mem_).mode_ == MEM_MODE_APPEND) {
      WebPSafeFree((idec->mem_).buf_);
      WebPSafeFree((idec->mem_).part0_buf_);
    }
    WebPFreeDecBuffer(&idec->output_);
    WebPSafeFree(idec);
    return;
  }
  return;
}

Assistant:

void WebPIDelete(WebPIDecoder* idec) {
  if (idec == NULL) return;
  if (idec->dec_ != NULL) {
    if (!idec->is_lossless_) {
      if (idec->state_ == STATE_VP8_DATA) {
        // Synchronize the thread, clean-up and check for errors.
        VP8ExitCritical((VP8Decoder*)idec->dec_, &idec->io_);
      }
      VP8Delete((VP8Decoder*)idec->dec_);
    } else {
      VP8LDelete((VP8LDecoder*)idec->dec_);
    }
  }
  ClearMemBuffer(&idec->mem_);
  WebPFreeDecBuffer(&idec->output_);
  WebPSafeFree(idec);
}